

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool __thiscall cmFileCopier::Install(cmFileCopier *this,char *fromFile,char *toFile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmCommand *this_00;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  size_t sVar5;
  MatchProperties match_properties;
  ostringstream e;
  allocator local_1d1;
  MatchProperties local_1d0;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  if (*fromFile == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"INSTALL encountered an empty string input file name.",0x34);
    this_00 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(this_00,&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar3 = 0;
  }
  else {
    local_1d0 = CollectMatchProperties(this,fromFile);
    uVar3 = 1;
    if (((ulong)local_1d0 & 1) == 0) {
      paVar1 = &local_1a8[0].field_2;
      local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
      sVar5 = strlen(fromFile);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,fromFile,fromFile + sVar5)
      ;
      std::__cxx11::string::string((string *)&local_1c8,toFile,&local_1d1);
      bVar2 = cmsys::SystemTools::SameFile(local_1a8,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (!bVar2) {
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
        sVar5 = strlen(fromFile);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,fromFile,fromFile + sVar5);
        bVar2 = cmsys::SystemTools::FileIsSymlink(local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if (bVar2) {
          uVar3 = InstallSymlink(this,fromFile,toFile);
        }
        else {
          local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
          sVar5 = strlen(fromFile);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,fromFile,fromFile + sVar5);
          bVar2 = cmsys::SystemTools::FileIsDirectory(local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != paVar1) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          if (bVar2) {
            uVar3 = InstallDirectory(this,fromFile,toFile,&local_1d0);
          }
          else {
            bVar2 = cmsys::SystemTools::FileExists(fromFile);
            if (bVar2) {
              uVar3 = InstallFile(this,fromFile,toFile,&local_1d0);
            }
            else {
              iVar4 = (*this->_vptr_cmFileCopier[5])(this,fromFile);
              uVar3 = (undefined1)iVar4;
            }
          }
        }
      }
    }
  }
  return (bool)uVar3;
}

Assistant:

bool cmFileCopier::Install(const char* fromFile, const char* toFile)
{
  if(!*fromFile)
    {
    std::ostringstream e;
    e << "INSTALL encountered an empty string input file name.";
    this->FileCommand->SetError(e.str());
    return false;
    }

  // Collect any properties matching this file name.
  MatchProperties match_properties = this->CollectMatchProperties(fromFile);

  // Skip the file if it is excluded.
  if(match_properties.Exclude)
    {
    return true;
    }

  if(cmSystemTools::SameFile(fromFile, toFile))
    {
    return true;
    }
  else if(cmSystemTools::FileIsSymlink(fromFile))
    {
    return this->InstallSymlink(fromFile, toFile);
    }
  else if(cmSystemTools::FileIsDirectory(fromFile))
    {
    return this->InstallDirectory(fromFile, toFile, match_properties);
    }
  else if(cmSystemTools::FileExists(fromFile))
    {
    return this->InstallFile(fromFile, toFile, match_properties);
    }
  return this->ReportMissing(fromFile);
}